

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::BeginQuery
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this,IQuery *pQuery,int param_2)

{
  Uint32 *pUVar1;
  QUERY_TYPE QueryType;
  COMMAND_QUEUE_TYPE CVar2;
  int iVar3;
  undefined4 extraout_var;
  COMMAND_QUEUE_TYPE CVar4;
  COMMAND_QUEUE_TYPE Type;
  string msg;
  char (*in_stack_ffffffffffffff88) [8];
  string local_70;
  String local_50;
  char *local_30;
  
  if (pQuery == (IQuery *)0x0) {
    FormatString<char[52]>
              (&local_70,(char (*) [52])"IDeviceContext::BeginQuery: pQuery must not be null");
    DebugAssertionFailed
              (local_70._M_dataplus._M_p,"BeginQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x687);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  iVar3 = (*(pQuery->super_IDeviceObject).super_IObject._vptr_IObject[4])(pQuery);
  QueryType = *(QUERY_TYPE *)(CONCAT44(extraout_var,iVar3) + 8);
  if (QueryType == QUERY_TYPE_TIMESTAMP) {
    FormatString<char[86]>
              (&local_70,
               (char (*) [86])
               "BeginQuery() is disabled for timestamp queries. Call EndQuery() to set the timestamp."
              );
    DebugAssertionFailed
              (local_70._M_dataplus._M_p,"BeginQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x68b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  CVar2 = (this->m_Desc).QueueType;
  if (CVar2 == COMMAND_QUEUE_TYPE_UNKNOWN) {
    if ((this->m_Desc).IsDeferred == false) {
      FormatString<char[79]>
                (&local_70,
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      DebugAssertionFailed
                (local_70._M_dataplus._M_p,"BeginQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x68e);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    FormatString<char[97]>
              (&local_70,
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    DebugAssertionFailed
              (local_70._M_dataplus._M_p,"BeginQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x68e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    CVar2 = (this->m_Desc).QueueType;
  }
  CVar4 = ~COMMAND_QUEUE_TYPE_GRAPHICS;
  if (QueryType == QUERY_TYPE_DURATION) {
    CVar4 = ~COMMAND_QUEUE_TYPE_TRANSFER;
  }
  if ((CVar4 | CVar2) != ~COMMAND_QUEUE_TYPE_UNKNOWN) {
    local_30 = GetQueryTypeString(QueryType);
    GetCommandQueueTypeString_abi_cxx11_(&local_50,(Diligent *)(ulong)(this->m_Desc).QueueType,Type)
    ;
    FormatString<char[27],char_const*,char[22],std::__cxx11::string,char[8]>
              (&local_70,(Diligent *)"BeginQuery for query type ",(char (*) [27])&local_30,
               (char **)0x35c335,(char (*) [22])&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",
               in_stack_ffffffffffffff88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    DebugAssertionFailed
              (local_70._M_dataplus._M_p,"BeginQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x68e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  CheckDynamicType<Diligent::QueryGLImpl,Diligent::IQuery>(pQuery);
  QueryBase<Diligent::EngineGLImplTraits>::OnBeginQuery
            ((QueryBase<Diligent::EngineGLImplTraits> *)pQuery,(DeviceContextImplType *)this);
  pUVar1 = &(this->m_Stats).CommandCounters.BeginQuery;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::BeginQuery(IQuery* pQuery, int)
{
    DEV_CHECK_ERR(pQuery != nullptr, "IDeviceContext::BeginQuery: pQuery must not be null");

    const QUERY_TYPE QueryType = pQuery->GetDesc().Type;
    DEV_CHECK_ERR(QueryType != QUERY_TYPE_TIMESTAMP,
                  "BeginQuery() is disabled for timestamp queries. Call EndQuery() to set the timestamp.");

    const COMMAND_QUEUE_TYPE QueueType = QueryType == QUERY_TYPE_DURATION ? COMMAND_QUEUE_TYPE_TRANSFER : COMMAND_QUEUE_TYPE_GRAPHICS;
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(QueueType, "BeginQuery for query type ", GetQueryTypeString(QueryType));

    ClassPtrCast<QueryImplType>(pQuery)->OnBeginQuery(static_cast<DeviceContextImplType*>(this));

    ++m_Stats.CommandCounters.BeginQuery;
}